

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_page_element * nk_create_page_element(nk_context *ctx)

{
  nk_page_element *size;
  void *in_RDI;
  nk_page_element *elem;
  nk_size in_stack_00000040;
  nk_size in_stack_00000048;
  nk_buffer_allocation_type in_stack_00000054;
  nk_buffer *in_stack_00000058;
  nk_pool *in_stack_fffffffffffffff8;
  
  if (*(long *)((long)in_RDI + 0x40e0) == 0) {
    if (*(int *)((long)in_RDI + 0x4074) == 0) {
      size = (nk_page_element *)
             nk_buffer_alloc(in_stack_00000058,in_stack_00000054,in_stack_00000048,in_stack_00000040
                            );
      if (size == (nk_page_element *)0x0) {
        return (nk_page_element *)0x0;
      }
    }
    else {
      size = nk_pool_alloc(in_stack_fffffffffffffff8);
      if (size == (nk_page_element *)0x0) {
        return (nk_page_element *)0x0;
      }
    }
  }
  else {
    size = *(nk_page_element **)((long)in_RDI + 0x40e0);
    *(nk_page_element **)((long)in_RDI + 0x40e0) = size->next;
  }
  nk_zero(in_RDI,(nk_size)size);
  size->next = (nk_page_element *)0x0;
  size->prev = (nk_page_element *)0x0;
  return size;
}

Assistant:

NK_LIB struct nk_page_element*
nk_create_page_element(struct nk_context *ctx)
{
struct nk_page_element *elem;
if (ctx->freelist) {
/* unlink page element from free list */
elem = ctx->freelist;
ctx->freelist = elem->next;
} else if (ctx->use_pool) {
/* allocate page element from memory pool */
elem = nk_pool_alloc(&ctx->pool);
NK_ASSERT(elem);
if (!elem) return 0;
} else {
/* allocate new page element from back of fixed size memory buffer */
NK_STORAGE const nk_size size = sizeof(struct nk_page_element);
NK_STORAGE const nk_size align = NK_ALIGNOF(struct nk_page_element);
elem = (struct nk_page_element*)nk_buffer_alloc(&ctx->memory, NK_BUFFER_BACK, size, align);
NK_ASSERT(elem);
if (!elem) return 0;
}
nk_zero_struct(*elem);
elem->next = 0;
elem->prev = 0;
return elem;
}